

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O0

int process_copy_output(process_info_t *p,FILE *stream)

{
  int iVar1;
  size_t sVar2;
  char local_428 [4];
  int r;
  char buf [1024];
  FILE *stream_local;
  process_info_t *p_local;
  
  iVar1 = fseek((FILE *)p->stdout_file,0,0);
  if (iVar1 < 0) {
    perror("fseek");
    p_local._4_4_ = -1;
  }
  else {
    while( true ) {
      sVar2 = fread(local_428,1,0x400,(FILE *)p->stdout_file);
      if ((int)sVar2 == 0) break;
      print_lines(local_428,(long)(int)sVar2,stream);
    }
    iVar1 = ferror((FILE *)p->stdout_file);
    if (iVar1 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      perror("read");
      p_local._4_4_ = -1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int process_copy_output(process_info_t* p, FILE* stream) {
  char buf[1024];
  int r;

  r = fseek(p->stdout_file, 0, SEEK_SET);
  if (r < 0) {
    perror("fseek");
    return -1;
  }

  /* TODO: what if the line is longer than buf */
  while ((r = fread(buf, 1, sizeof(buf), p->stdout_file)) != 0)
    print_lines(buf, r, stream);

  if (ferror(p->stdout_file)) {
    perror("read");
    return -1;
  }

  return 0;
}